

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

void __thiscall Company::Company(Company *this,Company *c)

{
  uint uVar1;
  int iVar2;
  Boss *this_00;
  Employee **ppEVar3;
  Employee *this_01;
  ulong uVar4;
  long lVar5;
  
  this->budget = c->budget;
  this_00 = (Boss *)operator_new(0xc0);
  Boss::Boss(this_00,c->boss);
  this->boss = this_00;
  uVar1 = Boss::getNumberOfEmployees(c->boss);
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)uVar1) {
    uVar4 = (ulong)uVar1 << 3;
  }
  ppEVar3 = (Employee **)operator_new__(uVar4);
  this->employees = ppEVar3;
  lVar5 = 0;
  while( true ) {
    iVar2 = Boss::getNumberOfEmployees(c->boss);
    if (iVar2 <= lVar5) break;
    this_01 = (Employee *)operator_new(0xb8);
    Employee::Employee(this_01,c->employees[lVar5]);
    this->employees[lVar5] = this_01;
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

Company::Company(const Company &c) {
    this->budget = c.budget;
    this->boss = new Boss(*c.boss);
    this->employees = new Employee *[c.boss->getNumberOfEmployees()];
    for (int i = 0; i < c.boss->getNumberOfEmployees(); ++i) {
        employees[i] = new Employee(*c.employees[i]);
    }
}